

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  TargetType tgtType;
  PolicyStatus PVar6;
  cmTarget *this_00;
  cmMessenger *messenger;
  char *__s;
  ostream *poVar7;
  PolicyID id;
  MessageType t;
  string prop;
  cmListFileBacktrace bt;
  string local_1e8;
  char *local_1c8;
  char *local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)name != 0x60) {
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  local_1c8 = &local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8 = '\0';
  this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name + 1,false);
  if (this_00 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045,false);
    if (PVar6 - NEW < 3) {
      t = FATAL_ERROR;
      bVar4 = true;
LAB_0022792b:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"get_target_property() called with non-existent target \"",
                 0x37);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,name[1]._M_dataplus._M_p,name[1]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar4 = false;
        goto LAB_00227a72;
      }
    }
    else if (PVar6 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x2d,id);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
      t = AUTHOR_WARNING;
      goto LAB_0022792b;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      bVar4 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name + 1);
      if (bVar4) {
        cmTarget::GetName_abi_cxx11_(this_00);
        std::__cxx11::string::_M_assign((string *)&local_1c8);
LAB_00227a00:
        bVar4 = true;
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,local_1c8);
        goto LAB_00227a72;
      }
    }
    else if ((args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
      messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      tgtType = cmTarget::GetType(this_00);
      bVar4 = cmTargetPropertyComputer::PassesWhitelist
                        (tgtType,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2,messenger,
                         (cmListFileBacktrace *)local_1a8);
      if ((bVar4) &&
         ((__s = cmTarget::GetComputedProperty
                           (this_00,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2,messenger,
                            (cmListFileBacktrace *)local_1a8), __s != (char *)0x0 ||
          (__s = cmTarget::GetProperty
                           (this_00,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2),
          __s != (char *)0x0)))) {
        pcVar3 = local_1c0;
        strlen(__s);
        bVar4 = true;
        std::__cxx11::string::_M_replace((ulong)&local_1c8,0,pcVar3,(ulong)__s);
      }
      else {
        bVar4 = false;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      if (bVar4) goto LAB_00227a00;
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append(local_1a8);
  cmMakefile::AddDefinition(pcVar1,name,(char *)local_1a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  bVar4 = true;
LAB_00227a72:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return bVar4;
}

Assistant:

bool cmGetTargetPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if (cmTarget* tgt = this->Makefile->FindTargetToUse(targetName)) {
    if (args[2] == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(targetName)) {
        prop = tgt->GetName();
        prop_exists = true;
      }
    } else if (!args[2].empty()) {
      const char* prop_cstr = nullptr;
      cmListFileBacktrace bt = this->Makefile->GetBacktrace();
      cmMessenger* messenger = this->Makefile->GetMessenger();
      if (cmTargetPropertyComputer::PassesWhitelist(tgt->GetType(), args[2],
                                                    messenger, bt)) {
        prop_cstr = tgt->GetComputedProperty(args[2], messenger, bt);
        if (!prop_cstr) {
          prop_cstr = tgt->GetProperty(args[2]);
        }
      }
      if (prop_cstr) {
        prop = prop_cstr;
        prop_exists = true;
      }
    }
  } else {
    bool issueMessage = false;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0045)) {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "get_target_property() called with non-existent target \""
        << targetName << "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }
  if (prop_exists) {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
  }
  this->Makefile->AddDefinition(var, (var + "-NOTFOUND").c_str());
  return true;
}